

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O1

Optional<llvm::ReplacementItem> * __thiscall
llvm::formatv_object_base::parseReplacementItem
          (Optional<llvm::ReplacementItem> *__return_storage_ptr__,formatv_object_base *this,
          StringRef Spec)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  size_t sVar4;
  StringRef SVar5;
  StringRef Chars;
  StringRef Chars_00;
  StringRef Chars_01;
  StringRef Chars_02;
  StringRef Chars_03;
  undefined1 auStack_70 [8];
  StringRef Spec_local;
  size_t local_50;
  size_t Align;
  size_t sStack_40;
  AlignStyle local_38;
  char local_32;
  char local_31;
  AlignStyle Where;
  char Pad;
  
  Spec_local.Data = Spec.Data;
  SVar5.Length = 2;
  SVar5.Data = "{}";
  auStack_70 = (undefined1  [8])this;
  _Align = StringRef::trim((StringRef *)auStack_70,SVar5);
  local_31 = ' ';
  local_50 = 0;
  local_38 = Right;
  Chars.Length = 6;
  Chars.Data = " \t\n\v\f\r";
  _Align = StringRef::trim((StringRef *)&Align,Chars);
  bVar1 = consumeUnsignedInteger((StringRef *)&Align,0,&Spec_local.Length);
  sVar4 = Spec_local.Length;
  if (bVar1) {
    __assert_fail("false && \"Invalid replacement sequence index!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                  ,0x45,
                  "static Optional<ReplacementItem> llvm::formatv_object_base::parseReplacementItem(StringRef)"
                 );
  }
  Chars_00.Length = 6;
  Chars_00.Data = " \t\n\v\f\r";
  _Align = StringRef::trim((StringRef *)&Align,Chars_00);
  pcVar3 = Align;
  if ((Align._8_8_ != 0) && (*pcVar3 == ',')) {
    sStack_40 = Align._8_8_ - 1;
    Align = (size_t)(pcVar3 + 1);
    bVar2 = consumeFieldLayout((StringRef *)&Align,&local_38,&local_50,&local_31);
    if (!bVar2) {
      __assert_fail("false && \"Invalid replacement field layout specification!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                    ,0x4c,
                    "static Optional<ReplacementItem> llvm::formatv_object_base::parseReplacementItem(StringRef)"
                   );
    }
  }
  Chars_01.Length = 6;
  Chars_01.Data = " \t\n\v\f\r";
  local_32 = bVar1;
  _Align = StringRef::trim((StringRef *)&Align,Chars_01);
  if (Align._8_8_ == 0) {
    SVar5 = (StringRef)ZEXT816(0);
  }
  else {
    SVar5 = (StringRef)ZEXT816(0);
    if (*Align == ':') {
      Spec_local.Length = (size_t)(Align + 1);
      Chars_02.Length = 6;
      Chars_02.Data = " \t\n\v\f\r";
      SVar5 = StringRef::trim((StringRef *)&Spec_local.Length,Chars_02);
      _Align = (StringRef)ZEXT816(0);
    }
  }
  Chars_03.Length = 6;
  Chars_03.Data = " \t\n\v\f\r";
  _Align = StringRef::trim((StringRef *)&Align,Chars_03);
  if (Align._8_8_ == 0) {
    if (local_32 != '\0') {
      sVar4 = 0;
    }
    (__return_storage_ptr__->Storage).field_0.value.Type = Format;
    (__return_storage_ptr__->Storage).field_0.value.Spec.Data = (char *)auStack_70;
    (__return_storage_ptr__->Storage).field_0.value.Spec.Length = (size_t)Spec_local.Data;
    (__return_storage_ptr__->Storage).field_0.value.Index = sVar4;
    (__return_storage_ptr__->Storage).field_0.value.Align = local_50;
    (__return_storage_ptr__->Storage).field_0.value.Where = local_38;
    (__return_storage_ptr__->Storage).field_0.value.Pad = local_31;
    *(StringRef *)((long)&(__return_storage_ptr__->Storage).field_0 + 0x30) = SVar5;
    (__return_storage_ptr__->Storage).hasVal = true;
    return __return_storage_ptr__;
  }
  __assert_fail("false && \"Unexpected characters found in replacement string!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                ,0x55,
                "static Optional<ReplacementItem> llvm::formatv_object_base::parseReplacementItem(StringRef)"
               );
}

Assistant:

Optional<ReplacementItem>
formatv_object_base::parseReplacementItem(StringRef Spec) {
  StringRef RepString = Spec.trim("{}");

  // If the replacement sequence does not start with a non-negative integer,
  // this is an error.
  char Pad = ' ';
  std::size_t Align = 0;
  AlignStyle Where = AlignStyle::Right;
  StringRef Options;
  size_t Index = 0;
  RepString = RepString.trim();
  if (RepString.consumeInteger(0, Index)) {
    assert(false && "Invalid replacement sequence index!");
    return ReplacementItem{};
  }
  RepString = RepString.trim();
  if (!RepString.empty() && RepString.front() == ',') {
    RepString = RepString.drop_front();
    if (!consumeFieldLayout(RepString, Where, Align, Pad))
      assert(false && "Invalid replacement field layout specification!");
  }
  RepString = RepString.trim();
  if (!RepString.empty() && RepString.front() == ':') {
    Options = RepString.drop_front().trim();
    RepString = StringRef();
  }
  RepString = RepString.trim();
  if (!RepString.empty()) {
    assert(false && "Unexpected characters found in replacement string!");
  }

  return ReplacementItem{Spec, Index, Align, Where, Pad, Options};
}